

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.cpp
# Opt level: O3

string * __thiscall
lossless_neural_sound::audio::Audio_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,Audio_error_category *this,int condition)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (condition == 3) {
    pcVar2 = "unsupported";
    pcVar1 = "";
  }
  else if (condition == 2) {
    pcVar2 = "corrupt file";
    pcVar1 = "";
  }
  else if (condition == 1) {
    pcVar2 = "format does not match";
    pcVar1 = "";
  }
  else {
    pcVar2 = "unknown error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Audio_error_category::message(int condition) const
{
    switch(static_cast<Audio_error_code>(condition))
    {
    case Audio_error_code::format_does_not_match:
        return "format does not match";
    case Audio_error_code::corrupt_file:
        return "corrupt file";
    case Audio_error_code::unsupported:
        return "unsupported";
    }
    return "unknown error";
}